

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O3

void __thiscall
uInputPlus::uInput::send_pos_relative(uInput *this,uInputCoordinate *movement,bool report)

{
  if (movement->X != 0) {
    emit(this,2,0,movement->X);
  }
  if (movement->Y != 0) {
    emit(this,2,1,movement->Y);
  }
  if (movement->Z != 0) {
    emit(this,2,2,movement->Z);
  }
  if (report) {
    emit(this,0,0,0);
    return;
  }
  return;
}

Assistant:

void uInput::send_pos_relative(const uInputCoordinate &movement, bool report) const {
	if (movement.X)
		emit(EV_REL, REL_X, movement.X);

	if (movement.Y)
		emit(EV_REL, REL_Y, movement.Y);

	if (movement.Z)
		emit(EV_REL, REL_Z, movement.Z);


	if (report)
		emit(EV_SYN, SYN_REPORT, 0);

}